

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::AppendAllocableHeapBlockList
          (HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list)

{
  Recycler *pRVar1;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  bool bVar2;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar3;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar4;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail;
  
  bVar2 = Js::Phases::IsEnabled
                    (&((this->super_HeapBucket).heapInfo)->recycler->recyclerFlagsTable->Trace,
                     ConcurrentSweepPhase);
  if ((bVar2) && (Js::Configuration::Global[0x291a2] == '\x01')) {
    pRVar1 = ((this->super_HeapBucket).heapInfo)->recycler;
    Output::Print(L"[GC #%d] [HeapBucket 0x%p] in AppendAllocableHeapBlockList [CollectionState: %d] \n"
                  ,(ulong)pRVar1->collectionCount,this,(ulong)(pRVar1->collectionState).value);
  }
  pSVar4 = this->heapBlockList;
  if (this->heapBlockList ==
      (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    this->heapBlockList = list;
  }
  else {
    do {
      pSVar3 = pSVar4;
      this_00 = (pSVar3->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
                super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
                super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
      if (this_00 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
      pSVar4 = HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                         (&this_00->super_HeapBlock);
    } while (pSVar4 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0)
    ;
    (pSVar3->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
    super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next =
         (SmallHeapBlockT<SmallAllocationBlockAttributes> *)list;
    if (this->nextAllocableBlockHead !=
        (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      return;
    }
  }
  this->nextAllocableBlockHead = list;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::AppendAllocableHeapBlockList(TBlockType * list)
{
#ifdef RECYCLER_TRACE
    if (this->GetRecycler()->GetRecyclerFlagsTable().Trace.IsEnabled(Js::ConcurrentSweepPhase) && CONFIG_FLAG_RELEASE(Verbose))
    {
        CollectionState collectionState = this->GetRecycler()->collectionState;
        Output::Print(_u("[GC #%d] [HeapBucket 0x%p] in AppendAllocableHeapBlockList [CollectionState: %d] \n"), this->GetRecycler()->collectionCount, this, collectionState);
    }
#endif
    // Add the list to the end of the current list
    TBlockType * currentHeapBlockList = this->heapBlockList;
    if (currentHeapBlockList == nullptr)
    {
        // There weren't any heap block list before, just move the list over and start allocate from it
        this->heapBlockList = list;
        this->nextAllocableBlockHead = list;
    }
    else
    {
        // Find the last block and append the list
        TBlockType * tail = HeapBlockList::Tail(currentHeapBlockList);
        Assert(tail != nullptr);
        tail->SetNextBlock(list);

        // If we are not currently allocating from the existing heapBlockList,
        // that means fill all the exiting one already, we should start with what we just appended.
        if (this->nextAllocableBlockHead == nullptr)
        {
            this->nextAllocableBlockHead = list;
        }
    }
}